

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

int __thiscall
Fl_Text_Display::skip_lines(Fl_Text_Display *this,int startPos,int nLines,bool startPosIsLineStart)

{
  int iVar1;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  
  if (this->mContinuousWrap != 0) {
    if (nLines != 0) {
      wrapped_line_counter
                (this,this->mBuffer,startPos,this->mBuffer->mLength,nLines,startPosIsLineStart,0,
                 &retPos,&retLines,&retLineStart,&retLineEnd,true);
      startPos = retPos;
    }
    return startPos;
  }
  iVar1 = Fl_Text_Buffer::skip_lines(this->mBuffer,startPos,nLines);
  return iVar1;
}

Assistant:

int Fl_Text_Display::skip_lines(int startPos, int nLines,
                                bool startPosIsLineStart) {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* if we're not wrapping use more efficient BufCountForwardNLines */
  if (!mContinuousWrap)
    return buffer()->skip_lines(startPos, nLines);

  /* wrappedLineCounter can't handle the 0 lines case */
  if (nLines == 0)
    return startPos;

  /* use the common line counting routine to count forward */
  wrapped_line_counter(buffer(), startPos, buffer()->length(),
                       nLines, startPosIsLineStart, 0,
                       &retPos, &retLines, &retLineStart, &retLineEnd);
  IS_UTF8_ALIGNED2(buffer(), retPos)
  return retPos;
}